

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtrace.h
# Opt level: O0

void __thiscall booster::backtrace::backtrace(backtrace *this,size_t frames_no)

{
  undefined4 uVar1;
  reference ppvVar2;
  vector<void_*,_std::allocator<void_*>_> *in_RSI;
  undefined8 *in_RDI;
  int size;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffdc;
  vector<void_*,_std::allocator<void_*>_> *in_stack_ffffffffffffffe0;
  int iVar3;
  
  *in_RDI = &PTR__backtrace_0010dd38;
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)0x1080d4);
  if (in_RSI != (vector<void_*,_std::allocator<void_*>_> *)0x0) {
    std::vector<void_*,_std::allocator<void_*>_>::resize
              (in_RSI,0,(value_type *)in_stack_ffffffffffffffe0);
    iVar3 = (int)in_RSI;
    ppvVar2 = std::vector<void_*,_std::allocator<void_*>_>::front
                        ((vector<void_*,_std::allocator<void_*>_> *)
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    uVar1 = booster::stack_trace::trace(ppvVar2,iVar3);
    std::vector<void_*,_std::allocator<void_*>_>::resize
              (in_stack_ffffffffffffffe0,CONCAT44(in_stack_ffffffffffffffdc,uVar1));
  }
  return;
}

Assistant:

backtrace(size_t frames_no = default_stack_size) 
        {
            if(frames_no == 0)
                return;
            frames_.resize(frames_no,0);
            int size = stack_trace::trace(&frames_.front(),frames_no);
            frames_.resize(size);
        }